

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::java::anon_unknown_0::GenerateSetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  string mask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string varName;
  
  GetBitFieldNameForBit_abi_cxx11_(&mask,(java *)(ulong)(uint)bitIndex,bitIndex);
  std::operator+(&varName,prefix,&mask);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::string
            ((string *)&mask,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)&local_60);
  std::operator+(&local_60,&varName," |= ");
  std::operator+(__return_storage_ptr__,&local_60,&mask);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::~string((string *)&varName);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateSetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = varName + " |= " + mask;
  return result;
}